

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O0

_Bool bitset_lenrange_empty(uint64_t *words,uint32_t start,uint32_t lenminusone)

{
  byte bVar1;
  uint uVar2;
  uint local_2c;
  uint32_t i;
  uint32_t endword;
  uint32_t firstword;
  uint32_t lenminusone_local;
  uint32_t start_local;
  uint64_t *words_local;
  
  local_2c = start >> 6;
  uVar2 = start + lenminusone >> 6;
  bVar1 = (byte)start;
  if (local_2c == uVar2) {
    words_local._7_1_ =
         (words[local_2c] &
         (0xffffffffffffffffU >> (0x3fU - (char)lenminusone & 0x3f)) << (bVar1 & 0x3f)) == 0;
  }
  else if ((words[local_2c] & -1L << (bVar1 & 0x3f)) == 0) {
    do {
      local_2c = local_2c + 1;
      if (uVar2 <= local_2c) {
        if ((words[uVar2] & 0xffffffffffffffffU >> ((bVar1 ^ 0xff) - (char)lenminusone & 0x3f)) != 0
           ) {
          return false;
        }
        return true;
      }
    } while (words[local_2c] == 0);
    words_local._7_1_ = false;
  }
  else {
    words_local._7_1_ = false;
  }
  return words_local._7_1_;
}

Assistant:

static inline bool bitset_lenrange_empty(const uint64_t *words, uint32_t start,
                                         uint32_t lenminusone) {
    uint32_t firstword = start / 64;
    uint32_t endword = (start + lenminusone) / 64;
    if (firstword == endword) {
        return (words[firstword] & ((~UINT64_C(0)) >> ((63 - lenminusone) % 64))
              << (start % 64)) == 0;
    }
    if (((words[firstword] & ((~UINT64_C(0)) << (start%64)))) != 0) {
        return false;
    }
    for (uint32_t i = firstword + 1; i < endword; i++) {
        if (words[i] != 0) {
            return false;
        }
    }
    if ((words[endword] & (~UINT64_C(0)) >> (((~start + 1) - lenminusone - 1) % 64)) != 0) {
        return false;
    }
    return true;
}